

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O0

void pltcalc::outputrows_da<pltcalc::outrec_granular_const&>
               (outrec_granular *o,int type,FILE *outFile)

{
  int strLen_00;
  char local_1038 [4];
  int strLen;
  char buffer [4096];
  int local_2c;
  int days;
  int occ_day;
  int occ_month;
  int occ_year;
  FILE *outFile_local;
  outrec_granular *poStack_10;
  int type_local;
  outrec_granular *o_local;
  
  _occ_month = outFile;
  outFile_local._4_4_ = type;
  poStack_10 = o;
  d((long)(int)(o->occ_date_id /
               (long)(int)((uint)((granular_date_ != 0 ^ 0xffU) & 1) * -0x59f + 0x5a0)),&occ_day,
    &days,&local_2c);
  strLen_00 = sprintf(local_1038,"%d,%d,%d,%d,%0.2f,%0.2f,%0.2f,%d,%d,%d\n",(double)poStack_10->mean
                      ,(double)poStack_10->standard_deviation,(double)poStack_10->exp_value,
                      (ulong)outFile_local._4_4_,(ulong)(uint)poStack_10->summary_id,
                      (ulong)(uint)poStack_10->period_no,(ulong)(uint)poStack_10->event_id,occ_day,
                      days,local_2c);
  writeoutput(local_1038,strLen_00,_occ_month);
  return;
}

Assistant:

void outputrows_da(const T& o, const int type, FILE * outFile)
	{
		int occ_year, occ_month, occ_day;
		int days = o.occ_date_id / (1440 - 1439 * !granular_date_);
		d(days, occ_year, occ_month, occ_day);

		char buffer[4096];
		int strLen;
		strLen = sprintf(buffer,
				"%d,%d,%d,%d,%0.2f,%0.2f,%0.2f,%d,%d,%d\n",
				 type, o.summary_id, o.period_no, o.event_id,
				 o.mean, o.standard_deviation, o.exp_value,
				 occ_year, occ_month, occ_day);
		writeoutput(buffer, strLen, outFile);
	}